

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O2

void __thiscall jbcoin::Generator::Generator(Generator *this,Seed *seed)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  uint128 local_28;
  
  (this->gen_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->gen_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gen_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.pn._0_8_ = *(undefined8 *)(seed->buf_)._M_elems;
  local_28.pn._8_8_ = *(undefined8 *)((seed->buf_)._M_elems + 8);
  generateRootDeterministicPublicKey((Blob *)&local_40,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&this->gen_,&local_40);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

explicit
    Generator (Seed const& seed)
    {
        // FIXME: Avoid copying the seed into a uint128 key only to have
        //        generateRootDeterministicPublicKey copy out of it.
        uint128 ui;
        std::memcpy(ui.data(),
            seed.data(), seed.size());
        gen_ = generateRootDeterministicPublicKey(ui);
    }